

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

int mainWithContext(int startArgumentIndex,int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  sysbvm_tuple_t tuple;
  size_t sVar2;
  sysbvm_tuple_t errorString;
  undefined1 local_118 [4];
  int exitCode;
  sysbvm_stackFrameLandingPadRecord_t topLevelFrame;
  char **argv_local;
  int argc_local;
  int startArgumentIndex_local;
  
  topLevelFrame.jmpbuffer[0].__saved_mask.__val[0xf] = (unsigned_long)argv;
  memset(local_118,0,0x100);
  topLevelFrame.previous._0_4_ = 7;
  topLevelFrame.previous._4_1_ = 1;
  sysbvm_stackFrame_enterContext(context,(sysbvm_stackFrameRecord_t *)local_118);
  iVar1 = _setjmp((__jmp_buf_tag *)&topLevelFrame.actionResult);
  if (iVar1 != 0) {
    tuple = sysbvm_tuple_asString(context,topLevelFrame.stackTrace);
    __stream = _stderr;
    sVar2 = sysbvm_tuple_getSizeInBytes(tuple);
    fprintf(__stream,"Unhandled exception: %.*s\n",sVar2 & 0xffffffff,tuple + 0x10);
    sysbvm_stackFrame_printStackTrace(context,topLevelFrame.exceptionFilter);
  }
  else {
    doMain(startArgumentIndex,argc,(char **)topLevelFrame.jmpbuffer[0].__saved_mask.__val[0xf]);
  }
  errorString._4_4_ = (uint)(iVar1 != 0);
  sysbvm_stackFrame_leaveContext();
  return errorString._4_4_;
}

Assistant:

int mainWithContext(int startArgumentIndex, int argc, const char *argv[])
{
    sysbvm_stackFrameLandingPadRecord_t topLevelFrame = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD,
        .keepStackTrace = true
    };

    sysbvm_stackFrame_enterContext(context, (sysbvm_stackFrameRecord_t*)&topLevelFrame);
    int exitCode = 0;
    if(!_setjmp(topLevelFrame.jmpbuffer))
    {
        doMain(startArgumentIndex, argc, argv);
    }
    else
    {
        sysbvm_tuple_t errorString = sysbvm_tuple_asString(context, topLevelFrame.exception);
        fprintf(stderr, "Unhandled exception: " SYSBVM_STRING_PRINTF_FORMAT "\n", SYSBVM_STRING_PRINTF_ARG(errorString));
        sysbvm_stackFrame_printStackTrace(context, topLevelFrame.stackTrace);
        exitCode = 1;
    }

    sysbvm_stackFrame_leaveContext();
    return exitCode;
}